

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

CreatePegInAddressResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::CreatePegInAddressRequestStruct,cfd::js::api::CreatePegInAddressResponseStruct>
          (CreatePegInAddressResponseStruct *__return_storage_ptr__,api *this,
          CreatePegInAddressRequestStruct *request,
          function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  CreatePegInAddressResponseStruct local_148;
  undefined1 local_29;
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  *call_function_local;
  CreatePegInAddressRequestStruct *request_local;
  CreatePegInAddressResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = &request->fedpegscript;
  call_function_local =
       (function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
        *)this;
  request_local = (CreatePegInAddressRequestStruct *)__return_storage_ptr__;
  CreatePegInAddressResponseStruct::CreatePegInAddressResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  ::operator()(&local_148,
               (function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
                *)request,(CreatePegInAddressRequestStruct *)call_function_local);
  CreatePegInAddressResponseStruct::operator=(__return_storage_ptr__,&local_148);
  CreatePegInAddressResponseStruct::~CreatePegInAddressResponseStruct(&local_148);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}